

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::prepareGlobals_abi_cxx11_
          (string *__return_storage_ptr__,VaryingLocationsTest *this,GLint last_in_loc,
          GLint last_out_loc)

{
  size_t position;
  GLchar buffer [16];
  size_t local_40;
  GLchar local_38 [24];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "const uint first_input_location  = 0u;\nconst uint first_output_location = 0u;\nconst uint last_input_location   = LAST_INPUTu;\nconst uint last_output_location  = LAST_OUTPUTu;\n"
             ,(allocator<char> *)&local_40);
  local_40 = 100;
  sprintf(local_38,"%d",(ulong)(uint)last_in_loc);
  Utils::replaceToken("LAST_INPUT",&local_40,local_38,__return_storage_ptr__);
  sprintf(local_38,"%d",(ulong)(uint)last_out_loc);
  Utils::replaceToken("LAST_OUTPUT",&local_40,local_38,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingLocationsTest::prepareGlobals(GLint last_in_loc, GLint last_out_loc)
{
	GLchar		buffer[16];
	std::string globals = "const uint first_input_location  = 0u;\n"
						  "const uint first_output_location = 0u;\n"
						  "const uint last_input_location   = LAST_INPUTu;\n"
						  "const uint last_output_location  = LAST_OUTPUTu;\n";
	size_t position = 100; /* Skip first part */

	sprintf(buffer, "%d", last_in_loc);
	Utils::replaceToken("LAST_INPUT", position, buffer, globals);

	sprintf(buffer, "%d", last_out_loc);
	Utils::replaceToken("LAST_OUTPUT", position, buffer, globals);

	return globals;
}